

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intlog.hpp
# Opt level: O2

uint64_t bitmanip::detail::approximateGuessTable<64ul>(Table<unsigned_char,_64UL> *table)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong approxFactor;
  ulong uVar4;
  
  uVar4 = 0x20;
  uVar3 = 0;
  do {
    if (uVar4 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    approxFactor = uVar3 | 1L << (uVar4 & 0x3f);
    iVar1 = compareApproximationToGuessTable<64ul>(approxFactor,table);
    uVar2 = approxFactor;
    if (iVar1 != -1) {
      uVar2 = uVar3;
    }
    uVar4 = uVar4 - 1;
    uVar3 = uVar2;
  } while (iVar1 != 0);
  return approxFactor;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t approximateGuessTable(const Table<unsigned char, SIZE> &table) noexcept
{
    std::uint64_t result = 0;
    for (unsigned b = 33; b-- != 0;) {
        std::uint64_t guessedResult = result | (std::uint64_t{1} << b);
        int cmp = compareApproximationToGuessTable(guessedResult, table);
        if (cmp == 0) {
            return guessedResult;
        }
        if (cmp == -1) {
            result = guessedResult;
        }
    }
    return NO_APPROXIMATION;
}